

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::parse_hex::test_method(parse_hex *this)

{
  long lVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  string_view hex_str_03;
  string_view hex_str_04;
  string_view hex_str_05;
  string_view hex_str_06;
  string_view hex_str_07;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  right_end;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  right_end_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  right_end_01;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  left_end;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  left_end_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  left_end_01;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  left_end_02;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  left_end_03;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  left_end_04;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  left_end_05;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  left_end_06;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  left_end_07;
  bool bVar2;
  undefined1 uVar3;
  lazy_ostream *plVar4;
  lazy_ostream *plVar5;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffeb48;
  char *in_stack_ffffffffffffeb50;
  char *in_stack_ffffffffffffeb58;
  char *pcVar6;
  basic_string_view<char,_std::char_traits<char>_> *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  const_string *in_stack_ffffffffffffeb70;
  size_type in_stack_ffffffffffffeb78;
  undefined7 in_stack_ffffffffffffeb80;
  undefined1 in_stack_ffffffffffffeb87;
  lazy_ostream *in_stack_ffffffffffffeb88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffeb90;
  undefined7 in_stack_ffffffffffffeb98;
  undefined1 in_stack_ffffffffffffeb9f;
  undefined7 in_stack_ffffffffffffebb0;
  undefined1 in_stack_ffffffffffffebb7;
  char *in_stack_ffffffffffffebb8;
  size_t in_stack_ffffffffffffebd0;
  char *in_stack_ffffffffffffebd8;
  char *pcVar8;
  undefined7 in_stack_ffffffffffffebf8;
  undefined1 in_stack_ffffffffffffebff;
  uchar *in_stack_ffffffffffffec00;
  equal_coll_impl *in_stack_ffffffffffffec08;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffec30;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffec38;
  undefined7 in_stack_ffffffffffffec40;
  undefined1 in_stack_ffffffffffffec47;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffec48;
  parse_hex *this_local;
  const_string local_f08 [2];
  lazy_ostream local_ee8 [3];
  assertion_result local_eb8 [2];
  lazy_ostream local_e7c [2];
  size_type local_e50;
  undefined1 local_e48 [16];
  undefined1 local_e38 [64];
  const_string local_df8 [2];
  lazy_ostream local_dd8 [3];
  assertion_result local_da8 [2];
  lazy_ostream local_d6c [2];
  size_type local_d40;
  undefined1 local_d38 [16];
  undefined1 local_d28 [64];
  const_string local_ce8 [2];
  lazy_ostream local_cc8 [2];
  assertion_result local_ca8 [2];
  lazy_ostream local_c6c;
  size_type local_c50;
  undefined1 local_c48 [16];
  undefined1 local_c38 [68];
  lazy_ostream local_bf4;
  undefined1 local_bd8 [64];
  const_string local_b98 [2];
  lazy_ostream local_b78 [3];
  assertion_result local_b48 [2];
  lazy_ostream local_b0c [2];
  size_type local_ae0;
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [68];
  lazy_ostream local_a84;
  size_type local_a70;
  undefined1 local_a68 [16];
  undefined1 local_a58 [68];
  lazy_ostream local_a14 [2];
  size_type local_9e8;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [68];
  lazy_ostream local_98c;
  size_type local_970;
  undefined1 local_968 [16];
  undefined1 local_958 [68];
  lazy_ostream local_914;
  size_type local_8f8;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [64];
  const_string local_8a0;
  lazy_ostream local_890 [2];
  assertion_result local_868 [3];
  const_string local_820;
  lazy_ostream local_810 [2];
  assertion_result local_7e8 [4];
  const_string local_788;
  lazy_ostream local_778 [2];
  assertion_result local_750 [3];
  const_string local_708;
  lazy_ostream local_6f8 [2];
  assertion_result local_6d0 [4];
  const_string local_670;
  lazy_ostream local_660 [2];
  assertion_result local_638 [3];
  const_string local_5f0;
  lazy_ostream local_5e0 [2];
  assertion_result local_5b8 [4];
  const_string local_558;
  lazy_ostream local_548 [2];
  assertion_result local_520 [3];
  const_string local_4d8;
  lazy_ostream local_4c8 [2];
  assertion_result local_4a0 [4];
  const_string local_440;
  lazy_ostream local_430 [2];
  assertion_result local_408 [3];
  const_string local_3b8;
  lazy_ostream local_3a8 [2];
  assertion_result local_380 [2];
  const_string local_348;
  lazy_ostream local_338 [2];
  assertion_result local_310 [2];
  Span<const_unsigned_char> local_2d8;
  vector<std::byte,_std::allocator<std::byte>_> hex_literal_vector;
  const_string local_2b0;
  lazy_ostream local_2a0 [2];
  assertion_result local_278 [2];
  Span<const_unsigned_char> hex_literal_span;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  string with_embedded_null;
  array<unsigned_char,_65UL> hex_literal_array_uint8;
  array<std::byte,_65UL> hex_literal_array;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb48);
  std::begin<unsigned_char_const,65ul>((uchar (*) [65])in_stack_ffffffffffffeb48);
  std::end<unsigned_char_const,65ul>((uchar (*) [65])in_stack_ffffffffffffeb48);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffeb48);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            (in_stack_ffffffffffffeb90,
             (uchar *)CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),
             (uchar *)in_stack_ffffffffffffeb88,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffeb48);
  hex_literal_span =
       MakeUCharSpan<std::array<std::byte,65ul>const&>
                 ((array<std::byte,_65UL> *)in_stack_ffffffffffffeb58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    Span<const_unsigned_char>::begin((Span<const_unsigned_char> *)in_stack_ffffffffffffeb48);
    Span<const_unsigned_char>::end((Span<const_unsigned_char> *)in_stack_ffffffffffffeb48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    right_end._M_current._7_1_ = in_stack_ffffffffffffec47;
    right_end._M_current._0_7_ = in_stack_ffffffffffffec40;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00,
               (uchar *)CONCAT17(in_stack_ffffffffffffebff,in_stack_ffffffffffffebf8),
               in_stack_ffffffffffffec48,right_end);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    in_stack_ffffffffffffeb58 = "hex_literal_span.end()";
    in_stack_ffffffffffffeb50 = "hex_literal_span.begin()";
    in_stack_ffffffffffffeb48 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_278,local_2a0,&local_2b0,0x9f,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::hex_literals::
  operator___hex_v<util::hex_literals::detail::Hex<131UL>___4,_103,_138,_253,_176,_254,_85,_72,_39,_25,_______>
            ();
  local_2d8 = MakeUCharSpan<std::vector<std::byte,std::allocator<std::byte>>const&>
                        ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffeb58)
  ;
  hex_literal_span = local_2d8;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    Span<const_unsigned_char>::begin((Span<const_unsigned_char> *)in_stack_ffffffffffffeb48);
    Span<const_unsigned_char>::end((Span<const_unsigned_char> *)in_stack_ffffffffffffeb48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    right_end_00._M_current._7_1_ = in_stack_ffffffffffffec47;
    right_end_00._M_current._0_7_ = in_stack_ffffffffffffec40;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00,
               (uchar *)CONCAT17(in_stack_ffffffffffffebff,in_stack_ffffffffffffebf8),
               in_stack_ffffffffffffec48,right_end_00);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    in_stack_ffffffffffffeb58 = "hex_literal_span.end()";
    in_stack_ffffffffffffeb50 = "hex_literal_span.begin()";
    in_stack_ffffffffffffeb48 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_310,local_338,&local_348,0xa3,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  memcpy(&hex_literal_array_uint8,&DAT_01cd2b52,0x41);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    std::array<unsigned_char,_65UL>::begin((array<unsigned_char,_65UL> *)in_stack_ffffffffffffeb48);
    std::array<unsigned_char,_65UL>::end((array<unsigned_char,_65UL> *)in_stack_ffffffffffffeb48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    right_end_01._M_current._7_1_ = in_stack_ffffffffffffec47;
    right_end_01._M_current._0_7_ = in_stack_ffffffffffffec40;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffffec08,in_stack_ffffffffffffec00,
               (uchar *)CONCAT17(in_stack_ffffffffffffebff,in_stack_ffffffffffffebf8),
               in_stack_ffffffffffffec48,right_end_01);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    in_stack_ffffffffffffeb58 = "hex_literal_array_uint8.end()";
    in_stack_ffffffffffffeb50 = "hex_literal_array_uint8.begin()";
    in_stack_ffffffffffffeb48 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_380,local_3a8,&local_3b8,0xa6,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::hex_literals::
  operator___hex_v_u8<util::hex_literals::detail::Hex<131UL>___4,_103,_138,_253,_176,_254,_85,_72,_39,_25,_______>
            ();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    left_end._M_current._7_1_ = in_stack_ffffffffffffec47;
    left_end._M_current._0_7_ = in_stack_ffffffffffffec40;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((equal_coll_impl *)CONCAT17(in_stack_ffffffffffffebff,in_stack_ffffffffffffebf8),
               in_stack_ffffffffffffec48,left_end,in_stack_ffffffffffffec38,
               in_stack_ffffffffffffec30);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    pbVar7 = (basic_string_view<char,_std::char_traits<char>_> *)0x1bb4f33;
    pcVar6 = "expected.begin()";
    in_stack_ffffffffffffeb58 = "result.end()";
    in_stack_ffffffffffffeb50 = "result.begin()";
    in_stack_ffffffffffffeb48 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_408,local_430,&local_440,0xa9,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(pbVar7,pcVar6);
  hex_str._M_len._7_1_ = in_stack_ffffffffffffebb7;
  hex_str._M_len._0_7_ = in_stack_ffffffffffffebb0;
  hex_str._M_str = in_stack_ffffffffffffebb8;
  ParseHex<unsigned_char>(hex_str);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    left_end_00._M_current._7_1_ = in_stack_ffffffffffffec47;
    left_end_00._M_current._0_7_ = in_stack_ffffffffffffec40;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((equal_coll_impl *)CONCAT17(in_stack_ffffffffffffebff,in_stack_ffffffffffffebf8),
               in_stack_ffffffffffffec48,left_end_00,in_stack_ffffffffffffec38,
               in_stack_ffffffffffffec30);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    pbVar7 = (basic_string_view<char,_std::char_traits<char>_> *)0x1bb4f33;
    pcVar6 = "expected.begin()";
    in_stack_ffffffffffffeb58 = "result.end()";
    in_stack_ffffffffffffeb50 = "result.begin()";
    in_stack_ffffffffffffeb48 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_4a0,local_4c8,&local_4d8,0xac,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(pbVar7,pcVar6);
  str._M_str = in_stack_ffffffffffffebd8;
  str._M_len = in_stack_ffffffffffffebd0;
  TryParseHex<unsigned_char>(str);
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::value
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             in_stack_ffffffffffffeb58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             in_stack_ffffffffffffeb48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    left_end_01._M_current._7_1_ = in_stack_ffffffffffffec47;
    left_end_01._M_current._0_7_ = in_stack_ffffffffffffec40;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((equal_coll_impl *)CONCAT17(in_stack_ffffffffffffebff,in_stack_ffffffffffffebf8),
               in_stack_ffffffffffffec48,left_end_01,in_stack_ffffffffffffec38,
               in_stack_ffffffffffffec30);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    pbVar7 = (basic_string_view<char,_std::char_traits<char>_> *)0x1bb4f33;
    pcVar6 = "expected.begin()";
    in_stack_ffffffffffffeb58 = "result.end()";
    in_stack_ffffffffffffeb50 = "result.begin()";
    in_stack_ffffffffffffeb48 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_520,local_548,&local_558,0xaf,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  __l._M_len = in_stack_ffffffffffffeb78;
  __l._M_array = (iterator)in_stack_ffffffffffffeb70;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pbVar7,__l);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(pbVar7,pcVar6);
  hex_str_00._M_len._7_1_ = in_stack_ffffffffffffebb7;
  hex_str_00._M_len._0_7_ = in_stack_ffffffffffffebb0;
  hex_str_00._M_str = in_stack_ffffffffffffebb8;
  ParseHex<unsigned_char>(hex_str_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    left_end_02._M_current._7_1_ = in_stack_ffffffffffffec47;
    left_end_02._M_current._0_7_ = in_stack_ffffffffffffec40;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((equal_coll_impl *)CONCAT17(in_stack_ffffffffffffebff,in_stack_ffffffffffffebf8),
               in_stack_ffffffffffffec48,left_end_02,in_stack_ffffffffffffec38,
               in_stack_ffffffffffffec30);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    pbVar7 = (basic_string_view<char,_std::char_traits<char>_> *)0x1bb4f33;
    pcVar6 = "expected.begin()";
    in_stack_ffffffffffffeb58 = "result.end()";
    in_stack_ffffffffffffeb50 = "result.begin()";
    in_stack_ffffffffffffeb48 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_5b8,local_5e0,&local_5f0,0xb4,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(pbVar7,pcVar6);
  str_00._M_str = in_stack_ffffffffffffebd8;
  str_00._M_len = in_stack_ffffffffffffebd0;
  TryParseHex<unsigned_char>(str_00);
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::value
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             in_stack_ffffffffffffeb58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             in_stack_ffffffffffffeb48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    left_end_03._M_current._7_1_ = in_stack_ffffffffffffec47;
    left_end_03._M_current._0_7_ = in_stack_ffffffffffffec40;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((equal_coll_impl *)CONCAT17(in_stack_ffffffffffffebff,in_stack_ffffffffffffebf8),
               in_stack_ffffffffffffec48,left_end_03,in_stack_ffffffffffffec38,
               in_stack_ffffffffffffec30);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    pbVar7 = (basic_string_view<char,_std::char_traits<char>_> *)0x1bb4f33;
    pcVar6 = "expected.begin()";
    in_stack_ffffffffffffeb58 = "result.end()";
    in_stack_ffffffffffffeb50 = "result.begin()";
    in_stack_ffffffffffffeb48 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_638,local_660,&local_670,0xb6,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  __l_00._M_len = in_stack_ffffffffffffeb78;
  __l_00._M_array = (iterator)in_stack_ffffffffffffeb70;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pbVar7,__l_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(pbVar7,pcVar6);
  hex_str_01._M_len._7_1_ = in_stack_ffffffffffffebb7;
  hex_str_01._M_len._0_7_ = in_stack_ffffffffffffebb0;
  hex_str_01._M_str = in_stack_ffffffffffffebb8;
  ParseHex<unsigned_char>(hex_str_01);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    left_end_04._M_current._7_1_ = in_stack_ffffffffffffec47;
    left_end_04._M_current._0_7_ = in_stack_ffffffffffffec40;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((equal_coll_impl *)CONCAT17(in_stack_ffffffffffffebff,in_stack_ffffffffffffebf8),
               in_stack_ffffffffffffec48,left_end_04,in_stack_ffffffffffffec38,
               in_stack_ffffffffffffec30);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    pbVar7 = (basic_string_view<char,_std::char_traits<char>_> *)0x1bb4f33;
    pcVar6 = "expected.begin()";
    in_stack_ffffffffffffeb58 = "result.end()";
    in_stack_ffffffffffffeb50 = "result.begin()";
    in_stack_ffffffffffffeb48 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_6d0,local_6f8,&local_708,0xbb,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(pbVar7,pcVar6);
  str_01._M_str = in_stack_ffffffffffffebd8;
  str_01._M_len = in_stack_ffffffffffffebd0;
  TryParseHex<unsigned_char>(str_01);
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::value
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             in_stack_ffffffffffffeb58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             in_stack_ffffffffffffeb48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    left_end_05._M_current._7_1_ = in_stack_ffffffffffffec47;
    left_end_05._M_current._0_7_ = in_stack_ffffffffffffec40;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((equal_coll_impl *)CONCAT17(in_stack_ffffffffffffebff,in_stack_ffffffffffffebf8),
               in_stack_ffffffffffffec48,left_end_05,in_stack_ffffffffffffec38,
               in_stack_ffffffffffffec30);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    pbVar7 = (basic_string_view<char,_std::char_traits<char>_> *)0x1bb4f33;
    pcVar6 = "expected.begin()";
    in_stack_ffffffffffffeb58 = "result.end()";
    in_stack_ffffffffffffeb50 = "result.begin()";
    in_stack_ffffffffffffeb48 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_750,local_778,&local_788,0xbd,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  __l_01._M_len = in_stack_ffffffffffffeb78;
  __l_01._M_array = (iterator)in_stack_ffffffffffffeb70;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pbVar7,__l_01);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(pbVar7,pcVar6);
  hex_str_02._M_len._7_1_ = in_stack_ffffffffffffebb7;
  hex_str_02._M_len._0_7_ = in_stack_ffffffffffffebb0;
  hex_str_02._M_str = in_stack_ffffffffffffebb8;
  ParseHex<unsigned_char>(hex_str_02);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    left_end_06._M_current._7_1_ = in_stack_ffffffffffffec47;
    left_end_06._M_current._0_7_ = in_stack_ffffffffffffec40;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((equal_coll_impl *)CONCAT17(in_stack_ffffffffffffebff,in_stack_ffffffffffffebf8),
               in_stack_ffffffffffffec48,left_end_06,in_stack_ffffffffffffec38,
               in_stack_ffffffffffffec30);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    pbVar7 = (basic_string_view<char,_std::char_traits<char>_> *)0x1bb4f33;
    pcVar6 = "expected.begin()";
    in_stack_ffffffffffffeb58 = "result.end()";
    in_stack_ffffffffffffeb50 = "result.begin()";
    in_stack_ffffffffffffeb48 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_7e8,local_810,&local_820,0xc2,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(pbVar7,pcVar6);
  str_02._M_str = in_stack_ffffffffffffebd8;
  str_02._M_len = in_stack_ffffffffffffebd0;
  TryParseHex<unsigned_char>(str_02);
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::value
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             in_stack_ffffffffffffeb58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             in_stack_ffffffffffffeb48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb50);
    left_end_07._M_current._7_1_ = in_stack_ffffffffffffec47;
    left_end_07._M_current._0_7_ = in_stack_ffffffffffffec40;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((equal_coll_impl *)CONCAT17(in_stack_ffffffffffffebff,in_stack_ffffffffffffebf8),
               in_stack_ffffffffffffec48,left_end_07,in_stack_ffffffffffffec38,
               in_stack_ffffffffffffec30);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1bb4f33;
    pcVar6 = "expected.begin()";
    in_stack_ffffffffffffeb58 = "result.end()";
    in_stack_ffffffffffffeb50 = "result.begin()";
    in_stack_ffffffffffffeb48 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_868,local_890,&local_8a0,0xc4,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    util::hex_literals::operator___hex_v<util::hex_literals::detail::Hex<1UL>______>();
    local_8f8 = std::vector<std::byte,_std::allocator<std::byte>_>::size
                          ((vector<std::byte,_std::allocator<std::byte>_> *)
                           in_stack_ffffffffffffeb48);
    local_914._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffeb58 = "0";
    in_stack_ffffffffffffeb50 = (char *)&local_914;
    in_stack_ffffffffffffeb48 = "\"\"_hex_v.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_8e0,local_8f0,0xc9,1,2,&local_8f8);
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffeb58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    util::hex_literals::operator___hex_v_u8<util::hex_literals::detail::Hex<1UL>______>();
    local_970 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_ffffffffffffeb48);
    local_98c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffeb58 = "0";
    in_stack_ffffffffffffeb50 = (char *)&local_98c;
    in_stack_ffffffffffffeb48 = "\"\"_hex_v_u8.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_958,local_968,0xca,1,2,&local_970);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,pcVar6);
    hex_str_03._M_len._7_1_ = in_stack_ffffffffffffebb7;
    hex_str_03._M_len._0_7_ = in_stack_ffffffffffffebb0;
    hex_str_03._M_str = in_stack_ffffffffffffebb8;
    ParseHex<unsigned_char>(hex_str_03);
    local_9e8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_ffffffffffffeb48);
    local_a14[0]._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffeb58 = "0";
    in_stack_ffffffffffffeb50 = (char *)local_a14;
    in_stack_ffffffffffffeb48 = "ParseHex(\"\").size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_9d0,local_9e0,0xcb,1,2,&local_9e8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,pcVar6);
    str_03._M_str = in_stack_ffffffffffffebd8;
    str_03._M_len = in_stack_ffffffffffffebd0;
    TryParseHex<unsigned_char>(str_03);
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::value
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_ffffffffffffeb58);
    local_a70 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_ffffffffffffeb48);
    local_a84._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffeb58 = "0";
    in_stack_ffffffffffffeb50 = (char *)&local_a84;
    in_stack_ffffffffffffeb48 = "TryParseHex<uint8_t>(\"\").value().size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_a58,local_a68,0xcc,1,2,&local_a70);
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_ffffffffffffeb48);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,pcVar6);
    hex_str_04._M_len._7_1_ = in_stack_ffffffffffffebb7;
    hex_str_04._M_len._0_7_ = in_stack_ffffffffffffebb0;
    hex_str_04._M_str = in_stack_ffffffffffffebb8;
    ParseHex<unsigned_char>(hex_str_04);
    local_ae0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_ffffffffffffeb48);
    local_b0c[0]._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffeb58 = "0";
    in_stack_ffffffffffffeb50 = (char *)local_b0c;
    in_stack_ffffffffffffeb48 = "ParseHex(\"AAF F\").size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_ac8,local_ad8,0xcf,1,2,&local_ae0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,pcVar6);
    str_04._M_str = in_stack_ffffffffffffebd8;
    str_04._M_len = in_stack_ffffffffffffebd0;
    TryParseHex<std::byte>(str_04);
    std::optional<std::vector<std::byte,_std::allocator<std::byte>_>_>::has_value
              ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb58,
               SUB81((ulong)in_stack_ffffffffffffeb50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    in_stack_ffffffffffffeb48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b48,local_b78,local_b98,0xd0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    std::optional<std::vector<std::byte,_std::allocator<std::byte>_>_>::~optional
              ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
               in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  s_abi_cxx11_((char *)in_stack_ffffffffffffeb88,
               CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    local_bf4._4_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffeb48);
    local_bf4._vptr_lazy_ostream._0_4_ = 0xb;
    in_stack_ffffffffffffeb58 = "11";
    in_stack_ffffffffffffeb50 = (char *)&local_bf4;
    in_stack_ffffffffffffeb48 = "with_embedded_null.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_bd8,&local_bf4.field_0xc,0xd6,1,2,
               (undefined1 *)((long)&local_bf4._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
    hex_str_05._M_len._7_1_ = in_stack_ffffffffffffebb7;
    hex_str_05._M_len._0_7_ = in_stack_ffffffffffffebb0;
    hex_str_05._M_str = in_stack_ffffffffffffebb8;
    ParseHex<unsigned_char>(hex_str_05);
    local_c50 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_ffffffffffffeb48);
    local_c6c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffeb58 = "0";
    in_stack_ffffffffffffeb50 = (char *)&local_c6c;
    in_stack_ffffffffffffeb48 = "ParseHex(with_embedded_null).size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_c38,local_c48,0xd7,1,2,&local_c50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
    str_05._M_str = in_stack_ffffffffffffebd8;
    str_05._M_len = in_stack_ffffffffffffebd0;
    TryParseHex<std::byte>(str_05);
    std::optional<std::vector<std::byte,_std::allocator<std::byte>_>_>::has_value
              ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb58,
               SUB81((ulong)in_stack_ffffffffffffeb50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    in_stack_ffffffffffffeb48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ca8,local_cc8,local_ce8,0xd8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    std::optional<std::vector<std::byte,_std::allocator<std::byte>_>_>::~optional
              ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
               in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    pcVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,pcVar6);
    hex_str_06._M_len._7_1_ = in_stack_ffffffffffffebb7;
    hex_str_06._M_len._0_7_ = in_stack_ffffffffffffebb0;
    hex_str_06._M_str = in_stack_ffffffffffffebb8;
    ParseHex<unsigned_char>(hex_str_06);
    local_d40 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_ffffffffffffeb48);
    local_d6c[0]._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffeb58 = "0";
    in_stack_ffffffffffffeb50 = (char *)local_d6c;
    in_stack_ffffffffffffeb48 = "ParseHex(\"1234 invalid 1234\").size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_d28,local_d38,0xdb,1,2,&local_d40);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,pcVar6);
    str_06._M_str = pcVar8;
    str_06._M_len = (size_t)plVar4;
    TryParseHex<std::byte>(str_06);
    std::optional<std::vector<std::byte,_std::allocator<std::byte>_>_>::has_value
              ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb58,
               SUB81((ulong)in_stack_ffffffffffffeb50 >> 0x38,0));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    in_stack_ffffffffffffeb48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_da8,local_dd8,local_df8,0xdc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    std::optional<std::vector<std::byte,_std::allocator<std::byte>_>_>::~optional
              ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
               in_stack_ffffffffffffeb48);
    uVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,(char (*) [1])in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,pcVar6);
    hex_str_07._M_len._7_1_ = uVar3;
    hex_str_07._M_len._0_7_ = in_stack_ffffffffffffebb0;
    hex_str_07._M_str = (char *)plVar5;
    ParseHex<unsigned_char>(hex_str_07);
    local_e50 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_ffffffffffffeb48);
    local_e7c[0]._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffeb58 = "0";
    in_stack_ffffffffffffeb50 = (char *)local_e7c;
    in_stack_ffffffffffffeb48 = "ParseHex(\"12 3\").size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_e38,local_e48,0xdf,1,2,&local_e50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeb48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb88,
               (const_string *)CONCAT17(in_stack_ffffffffffffeb87,in_stack_ffffffffffffeb80),
               in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,pcVar6);
    str_07._M_str = pcVar8;
    str_07._M_len = (size_t)plVar4;
    TryParseHex<std::byte>(str_07);
    std::optional<std::vector<std::byte,_std::allocator<std::byte>_>_>::has_value
              ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
               in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb58,
               SUB81((ulong)in_stack_ffffffffffffeb50 >> 0x38,0));
    in_stack_ffffffffffffeb88 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeb50,
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,
               (unsigned_long)in_stack_ffffffffffffeb48);
    in_stack_ffffffffffffeb48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_eb8,local_ee8,local_f08,0xe0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb48);
    std::optional<std::vector<std::byte,_std::allocator<std::byte>_>_>::~optional
              ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
               in_stack_ffffffffffffeb48);
    in_stack_ffffffffffffeb87 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffeb87);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb48);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffeb58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb58);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(parse_hex)
{
    std::vector<unsigned char> result;

    // Basic test vector
    std::vector<unsigned char> expected(std::begin(HEX_PARSE_OUTPUT), std::end(HEX_PARSE_OUTPUT));
    constexpr std::array<std::byte, 65> hex_literal_array{operator""_hex<util::detail::Hex(HEX_PARSE_INPUT)>()};
    auto hex_literal_span{MakeUCharSpan(hex_literal_array)};
    BOOST_CHECK_EQUAL_COLLECTIONS(hex_literal_span.begin(), hex_literal_span.end(), expected.begin(), expected.end());

    const std::vector<std::byte> hex_literal_vector{operator""_hex_v<util::detail::Hex(HEX_PARSE_INPUT)>()};
    hex_literal_span = MakeUCharSpan(hex_literal_vector);
    BOOST_CHECK_EQUAL_COLLECTIONS(hex_literal_span.begin(), hex_literal_span.end(), expected.begin(), expected.end());

    constexpr std::array<uint8_t, 65> hex_literal_array_uint8{operator""_hex_u8<util::detail::Hex(HEX_PARSE_INPUT)>()};
    BOOST_CHECK_EQUAL_COLLECTIONS(hex_literal_array_uint8.begin(), hex_literal_array_uint8.end(), expected.begin(), expected.end());

    result = operator""_hex_v_u8<util::detail::Hex(HEX_PARSE_INPUT)>();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    result = ParseHex(HEX_PARSE_INPUT);
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    result = TryParseHex<uint8_t>(HEX_PARSE_INPUT).value();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    // Spaces between bytes must be supported
    expected = {0x12, 0x34, 0x56, 0x78};
    result = ParseHex("12 34 56 78");
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());
    result = TryParseHex<uint8_t>("12 34 56 78").value();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    // Leading space must be supported (used in BerkeleyEnvironment::Salvage)
    expected = {0x89, 0x34, 0x56, 0x78};
    result = ParseHex(" 89 34 56 78");
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());
    result = TryParseHex<uint8_t>(" 89 34 56 78").value();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    // Mixed case and spaces are supported
    expected = {0xff, 0xaa};
    result = ParseHex("     Ff        aA    ");
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());
    result = TryParseHex<uint8_t>("     Ff        aA    ").value();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    // Empty string is supported
    static_assert(""_hex.empty());
    static_assert(""_hex_u8.empty());
    BOOST_CHECK_EQUAL(""_hex_v.size(), 0);
    BOOST_CHECK_EQUAL(""_hex_v_u8.size(), 0);
    BOOST_CHECK_EQUAL(ParseHex("").size(), 0);
    BOOST_CHECK_EQUAL(TryParseHex<uint8_t>("").value().size(), 0);

    // Spaces between nibbles is treated as invalid
    BOOST_CHECK_EQUAL(ParseHex("AAF F").size(), 0);
    BOOST_CHECK(!TryParseHex("AAF F").has_value());

    // Embedded null is treated as invalid
    const std::string with_embedded_null{" 11 "s
                                         " \0 "
                                         " 22 "s};
    BOOST_CHECK_EQUAL(with_embedded_null.size(), 11);
    BOOST_CHECK_EQUAL(ParseHex(with_embedded_null).size(), 0);
    BOOST_CHECK(!TryParseHex(with_embedded_null).has_value());

    // Non-hex is treated as invalid
    BOOST_CHECK_EQUAL(ParseHex("1234 invalid 1234").size(), 0);
    BOOST_CHECK(!TryParseHex("1234 invalid 1234").has_value());

    // Truncated input is treated as invalid
    BOOST_CHECK_EQUAL(ParseHex("12 3").size(), 0);
    BOOST_CHECK(!TryParseHex("12 3").has_value());
}